

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

int32_t testing::internal::Int32FromGTestEnv(char *flag,int32_t default_value)

{
  bool bVar1;
  char *str;
  char *in_RDX;
  int32_t iVar2;
  undefined1 local_68 [8];
  string env_var;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  int32_t local_1c [2];
  int32_t result;
  
  FlagToEnvVar_abi_cxx11_((string *)local_68,(internal *)flag,in_RDX);
  str = getenv((char *)local_68);
  iVar2 = default_value;
  if (str != (char *)0x0) {
    local_1c[0] = default_value;
    Message::Message((Message *)((long)&env_var.field_2 + 8));
    std::operator<<((ostream *)(env_var.field_2._8_8_ + 0x10),"Environment variable ");
    std::operator<<((ostream *)(env_var.field_2._8_8_ + 0x10),(string *)local_68);
    bVar1 = ParseInt32((Message *)((long)&env_var.field_2 + 8),str,local_1c);
    if (env_var.field_2._8_8_ != 0) {
      (**(code **)(*(long *)env_var.field_2._8_8_ + 8))();
    }
    iVar2 = local_1c[0];
    if (!bVar1) {
      Message::Message((Message *)&local_28);
      std::ostream::operator<<(local_28._M_head_impl + 0x10,default_value);
      Message::GetString_abi_cxx11_((string *)((long)&env_var.field_2 + 8),(Message *)&local_28);
      printf("The default value %s is used.\n",env_var.field_2._8_8_);
      std::__cxx11::string::~string((string *)(env_var.field_2._M_local_buf + 8));
      if (local_28._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_28._M_head_impl + 8))();
      }
      fflush(_stdout);
      iVar2 = default_value;
    }
  }
  std::__cxx11::string::~string((string *)local_68);
  return iVar2;
}

Assistant:

int32_t Int32FromGTestEnv(const char* flag, int32_t default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == nullptr) {
    // The environment variable is not set.
    return default_value;
  }

  int32_t result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var, string_value,
                  &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
}